

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_t * ptls_server_new(ptls_context_t *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  ptls_t *get_sni;
  void *get_sni_arg;
  int includes_appdata;
  
  get_sni = new_instance(ctx,1);
  get_sni->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (get_sni->field_19).server.early_data_skipped_bytes = 0xffffffff;
  uVar1 = ptls_log_point_maybe_active(&ptls_server_new::logpoint);
  if (uVar1 != 0) {
    uVar2 = ptls_log_conn_maybe_active
                      (&get_sni->log_state,(_func_char_ptr_void_ptr *)get_sni,get_sni_arg);
    if ((uVar2 & uVar1) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&ptls_server_new::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)get_sni);
        ptls_log__do_push_element_bool(",\"is_server\":",0xd,1);
        iVar3 = ptls_log__do_write_end
                          (&ptls_server_new::logpoint,&get_sni->log_state,ptls_get_server_name,
                           get_sni,includes_appdata);
        includes_appdata = 1;
      } while (iVar3 != 0);
    }
  }
  return get_sni;
}

Assistant:

ptls_t *ptls_server_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 1);
    tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    tls->server.early_data_skipped_bytes = UINT32_MAX;

    PTLS_PROBE(NEW, tls, 1);
    PTLS_LOG_CONN(new, tls, { PTLS_LOG_ELEMENT_BOOL(is_server, 1); });
    return tls;
}